

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.hpp
# Opt level: O0

packer<msgpack::v1::sbuffer> * __thiscall
msgpack::v1::adaptor::pack<std::tuple<int&&,char_const*&&>,void>::operator()
          (pack<std::tuple<int_&&,_const_char_*&&>,_void> *this,packer<msgpack::v1::sbuffer> *o,
          tuple<int_&&,_const_char_*&&> *v)

{
  uint32_t uVar1;
  undefined8 in_RDX;
  uint32_t n;
  packer<msgpack::v1::sbuffer> *in_RSI;
  uint32_t size;
  tuple<int_&&,_const_char_*&&> *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  
  n = (uint32_t)((ulong)in_RDX >> 0x20);
  uVar1 = checked_get_container_size<unsigned_long>(0x29617d);
  packer<msgpack::v1::sbuffer>::pack_array(in_RSI,n);
  StdTuplePacker<msgpack::v1::sbuffer,_const_std::tuple<int_&&,_const_char_*&&>_&,_2UL>::pack
            ((packer<msgpack::v1::sbuffer> *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffd8);
  return in_RSI;
}

Assistant:

msgpack::packer<Stream>& operator()(
        msgpack::packer<Stream>& o,
        const std::tuple<Args...>& v) const {
        uint32_t size = checked_get_container_size(sizeof...(Args));
        o.pack_array(size);
        StdTuplePacker<Stream, decltype(v), sizeof...(Args)>::pack(o, v);
        return o;
    }